

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcList_item *pSrc,Bitmask notReady,
               WhereLevel *pLevel)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  u8 uVar4;
  short sVar5;
  Vdbe *p;
  Table *pTVar6;
  WhereLoop *p_00;
  sqlite3 *db;
  SrcList *pSVar7;
  int *piVar8;
  bool bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  Expr *pEVar15;
  Index *pIdx;
  CollSeq *pCVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  WhereTerm *pWVar20;
  Op *pOVar21;
  ulong uVar22;
  WhereTerm *pWVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  int iVar27;
  bool bVar28;
  uint uVar29;
  uint uVar30;
  uint uVar32;
  ulong uVar31;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar37;
  ulong uVar36;
  uint uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uint uVar43;
  uint uVar45;
  uint uVar46;
  undefined1 auVar44 [16];
  uint uVar47;
  undefined1 auVar48 [16];
  ulong uVar49;
  ulong uVar50;
  Expr *local_b8;
  long local_a8;
  char *zNotUsed;
  code *local_58;
  code *local_50;
  u8 local_3c;
  anon_union_8_14_c5524298_for_u local_38;
  
  p = pParse->pVdbe;
  uVar30 = 0;
  iVar11 = sqlite3VdbeAddOp3(p,0x11,0,0,0);
  pTVar6 = pSrc->pTab;
  pWVar23 = pWC->a;
  pWVar20 = pWVar23 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  if ((long)pWC->nTerm < 1) {
    uVar22 = 0xffffffffffffffff;
    local_b8 = (Expr *)0x0;
  }
  else {
    uVar30 = 0;
    uVar22 = 0;
    bVar9 = false;
    local_b8 = (Expr *)0x0;
    do {
      if (((p_00->prereq == 0) && ((pWVar23->wtFlags & 2) == 0)) &&
         (pEVar15 = pWVar23->pExpr, (pEVar15->flags & 1) == 0)) {
        local_38.n = pSrc->iCursor;
        local_3c = '\x03';
        local_58 = exprNodeIsConstant;
        local_50 = sqlite3SelectWalkFail;
        if (pEVar15 != (Expr *)0x0) {
          walkExpr((Walker *)&zNotUsed,pEVar15);
        }
        if (local_3c != '\0') {
          db = pParse->db;
          if (pEVar15 == (Expr *)0x0) {
            pEVar15 = (Expr *)0x0;
          }
          else {
            pEVar15 = exprDup(db,pEVar15,0,(u8 **)0x0);
          }
          local_b8 = sqlite3ExprAnd(db,local_b8,pEVar15);
        }
      }
      iVar12 = termCanDriveIndex(pWVar23,pSrc,notReady);
      if (iVar12 == 0) {
LAB_0017bb86:
        bVar28 = true;
      }
      else {
        iVar12 = (pWVar23->u).leftColumn;
        uVar26 = 1L << ((byte)iVar12 & 0x3f);
        if (0x3f < (long)iVar12) {
          uVar26 = 0x8000000000000000;
        }
        if (!bVar9) {
          sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar6->zName,pTVar6->aCol[iVar12].zName);
        }
        bVar9 = true;
        if ((uVar26 & uVar22) != 0) goto LAB_0017bb86;
        iVar12 = whereLoopResize(pParse->db,p_00,uVar30 + 1);
        bVar28 = iVar12 == 0;
        if (bVar28) {
          p_00->aLTerm[(int)uVar30] = pWVar23;
          uVar22 = uVar22 | uVar26;
          uVar30 = uVar30 + 1;
        }
        bVar9 = true;
      }
      if (!bVar28) goto LAB_0017c255;
      pWVar23 = pWVar23 + 1;
    } while (pWVar23 < pWVar20);
    uVar22 = ~uVar22 | 0x8000000000000000;
  }
  p_00->nLTerm = (u16)uVar30;
  (p_00->u).btree.nEq = (u16)uVar30;
  p_00->wsFlags = 0x4241;
  uVar22 = uVar22 & pSrc->colUsed;
  sVar5 = pTVar6->nCol;
  uVar25 = (uint)sVar5;
  uVar17 = 0x3f;
  if (sVar5 < 0x3f) {
    uVar17 = uVar25;
  }
  if (0 < (int)uVar25) {
    uVar26 = (ulong)(uVar17 + 3 & 0x7c);
    lVar2 = (ulong)uVar17 - 1;
    auVar39._8_4_ = (int)lVar2;
    auVar39._0_8_ = lVar2;
    auVar39._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar42._8_4_ = (int)uVar22;
    auVar42._0_8_ = uVar22;
    auVar42._12_4_ = (int)(uVar22 >> 0x20);
    auVar44 = _DAT_00196080;
    auVar48 = _DAT_00196090;
    uVar33 = 0;
    uVar35 = 0;
    uVar38 = 0;
    do {
      uVar37 = uVar38;
      uVar34 = uVar35;
      uVar32 = uVar33;
      uVar29 = uVar30;
      auVar40 = auVar48;
      auVar41 = auVar44;
      uVar49 = 1L << auVar41._0_8_ & uVar22;
      uVar50 = 1L << auVar41._8_8_ & auVar42._8_8_;
      uVar31 = 1L << auVar40._0_8_ & uVar22;
      uVar36 = 1L << auVar40._8_8_ & auVar42._8_8_;
      uVar30 = (uVar29 - ((int)(uVar31 >> 0x20) == 0 && (int)uVar31 == 0)) + 1;
      uVar33 = (uVar32 - ((int)uVar36 == 0 && (int)(uVar36 >> 0x20) == 0)) + 1;
      uVar35 = (uVar34 - ((int)(uVar49 >> 0x20) == 0 && (int)uVar49 == 0)) + 1;
      uVar38 = (uVar37 - ((int)uVar50 == 0 && (int)(uVar50 >> 0x20) == 0)) + 1;
      auVar48._0_8_ = auVar40._0_8_ + 4;
      auVar48._8_8_ = auVar40._8_8_ + 4;
      auVar44._0_8_ = auVar41._0_8_ + 4;
      auVar44._8_8_ = auVar41._8_8_ + 4;
      uVar26 = uVar26 - 4;
    } while (uVar26 != 0);
    auVar39 = auVar39 ^ _DAT_001960a0;
    auVar40 = auVar40 ^ _DAT_001960a0;
    iVar12 = auVar39._4_4_;
    iVar13 = auVar39._12_4_;
    auVar41 = auVar41 ^ _DAT_001960a0;
    uVar43 = -(uint)(iVar12 < auVar40._4_4_ ||
                    auVar40._4_4_ == iVar12 && auVar39._0_4_ < auVar40._0_4_);
    uVar45 = -(uint)(iVar13 < auVar40._12_4_ ||
                    auVar40._12_4_ == iVar13 && auVar39._8_4_ < auVar40._8_4_);
    uVar46 = -(uint)(iVar12 < auVar41._4_4_ ||
                    auVar41._4_4_ == iVar12 && auVar39._0_4_ < auVar41._0_4_);
    uVar47 = -(uint)(iVar13 < auVar41._12_4_ ||
                    auVar41._12_4_ == iVar13 && auVar39._8_4_ < auVar41._8_4_);
    uVar30 = (~uVar47 & uVar38 | uVar37 & uVar47) + (~uVar45 & uVar33 | uVar32 & uVar45) +
             (~uVar46 & uVar35 | uVar34 & uVar46) + (~uVar43 & uVar30 | uVar29 & uVar43);
  }
  iVar12 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar12 = uVar25 - 0x3e;
  }
  uVar26 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar12 + uVar30),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar6;
    pWVar23 = pWC->a;
    if (pWVar23 < pWVar20) {
      uVar26 = 0;
      uVar31 = 0;
      do {
        iVar13 = termCanDriveIndex(pWVar23,pSrc,notReady);
        if (iVar13 != 0) {
          iVar13 = (pWVar23->u).leftColumn;
          uVar36 = 1L << ((byte)iVar13 & 0x3f);
          if (0x3f < iVar13) {
            uVar36 = 0x8000000000000000;
          }
          if ((uVar36 & uVar31) == 0) {
            pEVar15 = pWVar23->pExpr;
            iVar18 = (int)uVar26;
            pIdx->aiColumn[iVar18] = (i16)iVar13;
            pCVar16 = sqlite3BinaryCompareCollSeq(pParse,pEVar15->pLeft,pEVar15->pRight);
            pcVar19 = "BINARY";
            if (pCVar16 != (CollSeq *)0x0) {
              pcVar19 = pCVar16->zName;
            }
            uVar31 = uVar31 | uVar36;
            pIdx->azColl[iVar18] = pcVar19;
            uVar26 = (ulong)(iVar18 + 1);
          }
        }
        pWVar23 = pWVar23 + 1;
      } while (pWVar23 < pWVar20);
    }
    if (0 < sVar5) {
      uVar31 = 0;
      do {
        if ((uVar22 >> (uVar31 & 0x3f) & 1) != 0) {
          iVar13 = (int)uVar26;
          pIdx->aiColumn[iVar13] = (i16)uVar31;
          pIdx->azColl[iVar13] = "BINARY";
          uVar26 = (ulong)(iVar13 + 1);
        }
        uVar31 = uVar31 + 1;
      } while (uVar17 != uVar31);
    }
    if (((long)pSrc->colUsed < 0) && (0x3f < pTVar6->nCol)) {
      uVar26 = (ulong)(int)uVar26;
      iVar13 = 0x3f;
      do {
        pIdx->aiColumn[uVar26] = (i16)iVar13;
        pIdx->azColl[uVar26] = "BINARY";
        uVar26 = uVar26 + 1;
        iVar13 = iVar13 + 1;
      } while (iVar13 < pTVar6->nCol);
    }
    iVar27 = (int)uVar26;
    pIdx->aiColumn[iVar27] = -1;
    pIdx->azColl[iVar27] = "BINARY";
    iVar13 = pParse->nTab;
    pParse->nTab = iVar13 + 1;
    pLevel->iIdxCur = iVar13;
    iVar18 = 0;
    sqlite3VdbeAddOp3(p,0x70,iVar13,iVar12 + uVar30,0);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    pSVar7 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      iVar12 = pLevel->iTabCur;
      iVar13 = 0x24;
    }
    else {
      iVar12 = pSVar7->a[bVar3].regReturn;
      iVar18 = sqlite3VdbeAddOp3(p,0x46,0,0,0);
      sqlite3VdbeAddOp3(p,0xd,iVar12,0,pSVar7->a[bVar3].addrFillSub);
      iVar13 = 0xe;
    }
    iVar12 = sqlite3VdbeAddOp3(p,iVar13,iVar12,0,0);
    if (local_b8 == (Expr *)0x0) {
      local_a8 = -1;
    }
    else {
      uVar30 = sqlite3VdbeMakeLabel(p);
      sqlite3ExprIfFalse(pParse,local_b8,uVar30,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
      local_a8 = (long)(int)~uVar30;
    }
    if (pParse->nTempReg == '\0') {
      iVar13 = pParse->nMem + 1;
      pParse->nMem = iVar13;
    }
    else {
      bVar10 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar10;
      iVar13 = pParse->aTempReg[bVar10];
    }
    iVar14 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar13,0,(int *)0x0,(Index *)0x0,0)
    ;
    sqlite3VdbeAddOp3(p,0x85,pLevel->iIdxCur,iVar13,0);
    iVar24 = p->nOp;
    if (0 < (long)iVar24) {
      p->aOp[(long)iVar24 + -1].p5 = 0x10;
    }
    if ((local_b8 != (Expr *)0x0) && (piVar8 = p->pParse->aLabel, piVar8 != (int *)0x0)) {
      piVar8[local_a8] = iVar24;
    }
    if ((pSVar7->a[bVar3].fg.field_0x1 & 0x10) == 0) {
      iVar18 = pLevel->iTabCur;
      iVar24 = 5;
      iVar27 = iVar12 + 1;
    }
    else {
      if (iVar18 < 0) {
        iVar18 = p->nOp + -1;
      }
      if (p->db->mallocFailed == '\0') {
        pOVar21 = p->aOp + iVar18;
      }
      else {
        pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar21->p2 = iVar14 + iVar27;
      translateColumnToCopy(pParse,iVar12,pLevel->iTabCur,pSVar7->a[bVar3].regResult,1);
      iVar24 = 0xb;
      iVar18 = 0;
      iVar27 = iVar12;
    }
    sqlite3VdbeAddOp3(p,iVar24,iVar18,iVar27,0);
    iVar18 = p->nOp;
    if (0 < (long)iVar18) {
      p->aOp[(long)iVar18 + -1].p5 = 3;
    }
    uVar4 = p->db->mallocFailed;
    if (uVar4 == '\0') {
      iVar27 = iVar18 + -1;
      if (-1 < iVar12) {
        iVar27 = iVar12;
      }
      pOVar21 = p->aOp + iVar27;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = iVar18;
    if (iVar13 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar13;
      }
    }
    if (uVar4 == '\0') {
      iVar12 = p->nOp + -1;
      if (-1 < iVar11) {
        iVar12 = iVar11;
      }
      pOVar21 = p->aOp + iVar12;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p2 = p->nOp;
  }
LAB_0017c255:
  if (local_b8 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(pParse->db,local_b8);
  }
  return;
}

Assistant:

static void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  WhereClause *pWC,           /* The WHERE clause */
  struct SrcList_item *pSrc,  /* The FROM clause term to get the next index */
  Bitmask notReady,           /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  struct SrcList_item *pTabItem;  /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    assert( !ExprHasProperty(pExpr, EP_FromJoin)    /* prereq always non-zero */
         || pExpr->iRightJoinTable!=pSrc->iCursor   /*   for the right-hand   */
         || pLoop->prereq!=0 );                     /*   table of a LEFT JOIN */
    if( pLoop->prereq==0
     && (pTerm->wtFlags & TERM_VIRTUAL)==0
     && !ExprHasProperty(pExpr, EP_FromJoin)
     && sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor) ){
      pPartial = sqlite3ExprAnd(pParse->db, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol = pTerm->u.leftColumn;
      Bitmask cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.leftColumn;
        pColl = sqlite3BinaryCompareCollSeq(pParse, pX->pLeft, pX->pRight);
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(v);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, 1);
    sqlite3VdbeGoto(v, addrTop);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
  }
  sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);
  
  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}